

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O0

void Assimp::IFC::ConvertDirection(IfcVector3 *out,IfcDirection *in)

{
  value_type vVar1;
  IfcFloat IVar2;
  const_reference pvVar3;
  double *pdVar4;
  double f;
  IfcFloat len;
  size_t i;
  double local_28;
  double local_20;
  IfcDirection *local_18;
  IfcDirection *in_local;
  IfcVector3 *out_local;
  
  local_18 = in;
  in_local = (IfcDirection *)out;
  aiVector3t<double>::aiVector3t((aiVector3t<double> *)&i);
  (in_local->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)i;
  *(double *)
   &(in_local->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x8 = local_28;
  *(double *)
   &(in_local->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = local_20;
  len = 0.0;
  while( true ) {
    IVar2 = (IfcFloat)
            std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)
                       &(local_18->super_IfcGeometricRepresentationItem).field_0x30);
    if ((ulong)IVar2 <= (ulong)len) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &(local_18->super_IfcGeometricRepresentationItem).field_0x30,(size_type)len)
    ;
    vVar1 = *pvVar3;
    pdVar4 = aiVector3t<double>::operator[]((aiVector3t<double> *)in_local,SUB84(len,0));
    *pdVar4 = vVar1;
    len = (IfcFloat)((long)len + 1);
  }
  f = aiVector3t<double>::Length((aiVector3t<double> *)in_local);
  if (1e-06 <= f) {
    aiVector3t<double>::operator/=((aiVector3t<double> *)in_local,f);
  }
  else {
    LogFunctions<Assimp::IFCImporter>::LogWarn
              (
              "direction vector magnitude too small, normalization would result in a division by zero"
              );
  }
  return;
}

Assistant:

void ConvertDirection(IfcVector3& out, const Schema_2x3::IfcDirection& in)
{
    out = IfcVector3();
    for(size_t i = 0; i < in.DirectionRatios.size(); ++i) {
        out[static_cast<unsigned int>(i)] = in.DirectionRatios[i];
    }
    const IfcFloat len = out.Length();
    if (len<1e-6) {
        IFCImporter::LogWarn("direction vector magnitude too small, normalization would result in a division by zero");
        return;
    }
    out /= len;
}